

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAligned(SerialArena *this,size_t n)

{
  char *pcVar1;
  void *pvVar2;
  
  pcVar1 = this->ptr_;
  if (n <= (ulong)((long)this->limit_ - (long)pcVar1)) {
    this->ptr_ = pcVar1 + n;
    return pcVar1;
  }
  pvVar2 = AllocateAlignedFallback(this,n);
  return pvVar2;
}

Assistant:

void* AllocateAligned(size_t n) {
    GOOGLE_DCHECK_EQ(internal::AlignUpTo8(n), n);  // Must be already aligned.
    GOOGLE_DCHECK_GE(limit_, ptr_);
    if (PROTOBUF_PREDICT_FALSE(!HasSpace(n))) {
      return AllocateAlignedFallback(n);
    }
    void* ret = ptr_;
    ptr_ += n;
#ifdef ADDRESS_SANITIZER
    ASAN_UNPOISON_MEMORY_REGION(ret, n);
#endif  // ADDRESS_SANITIZER
    return ret;
  }